

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O2

void zPrint_Dense_Matrix(char *what,SuperMatrix *A)

{
  uint uVar1;
  uint *puVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  puVar2 = (uint *)A->Store;
  uVar1 = *puVar2;
  iVar4 = 0;
  printf("\nDense matrix %s:\n",what);
  printf("Stype %d, Dtype %d, Mtype %d\n",(ulong)A->Stype,(ulong)A->Dtype,(ulong)A->Mtype);
  lVar3 = *(long *)(puVar2 + 2);
  printf("nrow %d, ncol %d, lda %d\n",(ulong)(uint)A->nrow,(ulong)(uint)A->ncol,(ulong)uVar1);
  printf("\nnzval: ");
  for (lVar6 = 0; lVar6 < A->ncol; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; SBORROW8(lVar5,(long)A->nrow * 2) != lVar5 + (long)A->nrow * -2 < 0;
        lVar5 = lVar5 + 1) {
      printf("%f  ",*(undefined8 *)(lVar3 + (long)iVar4 * 8 + lVar5 * 8));
    }
    putchar(10);
    iVar4 = iVar4 + uVar1 * 2;
  }
  putchar(10);
  fflush(_stdout);
  return;
}

Assistant:

void
zPrint_Dense_Matrix(char *what, SuperMatrix *A)
{
    DNformat     *Astore = (DNformat *) A->Store;
    register int i, j, lda = Astore->lda;
    double       *dp;
    
    printf("\nDense matrix %s:\n", what);
    printf("Stype %d, Dtype %d, Mtype %d\n", A->Stype,A->Dtype,A->Mtype);
    dp = (double *) Astore->nzval;
    printf("nrow %d, ncol %d, lda %d\n", (int)A->nrow, (int)A->ncol, lda);
    printf("\nnzval: ");
    for (j = 0; j < A->ncol; ++j) {
        for (i = 0; i < 2*A->nrow; ++i) printf("%f  ", dp[i + j*2*lda]);
        printf("\n");
    }
    printf("\n");
    fflush(stdout);
}